

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

void display_resets(CHAR_DATA *ch)

{
  short sVar1;
  char *pcVar2;
  OBJ_INDEX_DATA *pOVar3;
  OBJ_INDEX_DATA *pOVar4;
  ROOM_INDEX_DATA *pRVar5;
  MOB_INDEX_DATA *pMVar6;
  MOB_INDEX_DATA *pMVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  int bits;
  char *pcVar11;
  RESET_DATA *pRVar12;
  MOB_INDEX_DATA *local_2448;
  char buf [4608];
  char final [4608];
  
  pRVar12 = (RESET_DATA *)&ch->in_room->reset_first;
  final[0] = '\0';
  send_to_char(" No.  Loads    Description       Location         Vnum   Mx Mn Description\n\r==== ======== ============= =================== ======== ===== ===========\n\r"
               ,ch);
  iVar10 = 1;
  local_2448 = (MOB_INDEX_DATA *)0x0;
  do {
    pRVar12 = pRVar12->next;
    if (pRVar12 == (RESET_DATA *)0x0) {
      return;
    }
    final[0] = '\0';
    sprintf(final,"[%2d] ",iVar10);
    switch(pRVar12->command) {
    case 'D':
      pRVar5 = get_room_index((int)pRVar12->arg1);
      sVar1 = pRVar12->arg1;
      pcVar8 = capitalize(dir_name[pRVar12->arg2]);
      pcVar11 = pRVar5->name;
      pcVar2 = flag_string_old(door_resets,(int)pRVar12->arg3);
      sprintf(buf,"R[%5d] %s door of %-19.19s reset to %s\n\r",(ulong)(uint)(int)sVar1,pcVar8,
              pcVar11,pcVar2);
      break;
    case 'E':
    case 'G':
      pOVar3 = get_obj_index((int)pRVar12->arg1);
      if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
        uVar9 = (ulong)(uint)(int)pRVar12->arg1;
        pcVar11 = "Give/Equip Object - Bad Object %d\n\r";
        goto LAB_0039a248;
      }
      if (local_2448 == (MOB_INDEX_DATA *)0x0) {
        builtin_strncpy(buf + 0x20,"Mobile\n\r",9);
        builtin_strncpy(buf + 0x10,"t - No Previous ",0x10);
        builtin_strncpy(buf,"Give/Equip Objec",0x10);
        strcat(final,buf);
        local_2448 = (MOB_INDEX_DATA *)0x0;
      }
      else {
        sVar1 = pRVar12->arg1;
        pcVar11 = pOVar3->short_descr;
        if (local_2448->pShop == (SHOP_DATA *)0x0) {
          bits = -1;
          if (pRVar12->command != 'G') {
            bits = (int)pRVar12->arg3;
          }
          pcVar8 = flag_string_old(wear_loc_strings,bits);
          sprintf(buf,"O[%5d] %-13.13s %-19.19s M[%5d]       %-15.15s\n\r",(ulong)(uint)(int)sVar1,
                  pcVar11,pcVar8,(ulong)(uint)(int)local_2448->vnum,local_2448->short_descr);
        }
        else {
          sprintf(buf,"O[%5d] %-13.13s in the inventory of S[%5d]       %-15.15s\n\r",
                  (ulong)(uint)(int)sVar1,pcVar11,(ulong)(uint)(int)local_2448->vnum,
                  local_2448->short_descr);
        }
        strcat(final,buf);
      }
      goto LAB_0039a05a;
    case 'F':
      pMVar7 = get_mob_index((int)pRVar12->arg1);
      pMVar6 = get_mob_index((int)pRVar12->arg2);
      sprintf(buf,"R[%5d] %-13.13s %-19.19s M[%5d]        %-15.15s\n\r",
              (ulong)(uint)(int)pMVar7->vnum,pMVar7->short_descr,"will follow",
              (ulong)(uint)(int)pMVar6->vnum,pMVar6->short_descr);
      break;
    default:
      sprintf(buf,"Bad reset command: %c.",(ulong)(uint)(int)pRVar12->command);
      break;
    case 'M':
      pMVar7 = get_mob_index((int)pRVar12->arg1);
      if (pMVar7 == (MOB_INDEX_DATA *)0x0) {
        sVar1 = pRVar12->arg1;
        pcVar11 = "Load Mobile - Bad Mob %d\n\r";
      }
      else {
        pRVar5 = get_room_index((int)pRVar12->arg3);
        if (pRVar5 != (ROOM_INDEX_DATA *)0x0) {
          sprintf(buf,"M[%5d] %-13.13s in room             R[%5d] %2d-%2d %-15.15s\n\r",
                  (ulong)(uint)(int)pRVar12->arg1,pMVar7->short_descr,
                  (ulong)(uint)(int)pRVar12->arg3,(ulong)(uint)(int)pRVar12->arg2,
                  (ulong)(uint)(int)pRVar12->arg4,pRVar5->name);
          strcat(final,buf);
          pRVar5 = get_room_index(pRVar5->vnum + -1);
          local_2448 = pMVar7;
          if ((pRVar5 != (ROOM_INDEX_DATA *)0x0) && ((pRVar5->room_flags[0] & 0x1000) != 0)) {
            final[5] = 'P';
          }
          goto LAB_0039a05a;
        }
        sVar1 = pRVar12->arg3;
        pcVar11 = "Load Mobile - Bad Room %d\n\r";
      }
      sprintf(buf,pcVar11,(ulong)(uint)(int)sVar1);
      strcat(final,buf);
      goto LAB_0039a289;
    case 'O':
      pOVar3 = get_obj_index((int)pRVar12->arg1);
      if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
        uVar9 = (ulong)(uint)(int)pRVar12->arg1;
        pcVar11 = "Load Object - Bad Object %d\n\r";
      }
      else {
        pRVar5 = get_room_index((int)pRVar12->arg3);
        if (pRVar5 != (ROOM_INDEX_DATA *)0x0) {
          sprintf(buf,"O[%5d] %-13.13s in room             R[%5d]       %-15.15s\n\r",
                  (ulong)(uint)(int)pRVar12->arg1,pOVar3->short_descr,
                  (ulong)(uint)(int)pRVar12->arg3,pRVar5->name);
          break;
        }
        uVar9 = (ulong)(uint)(int)pRVar12->arg3;
        pcVar11 = "Load Object - Bad Room %d\n\r";
      }
      goto LAB_0039a248;
    case 'P':
      pOVar3 = get_obj_index((int)pRVar12->arg1);
      if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
        uVar9 = (ulong)(uint)(int)pRVar12->arg1;
        pcVar11 = "Put Object - Bad Object %d\n\r";
      }
      else {
        pOVar4 = get_obj_index((int)pRVar12->arg3);
        if (pOVar4 != (OBJ_INDEX_DATA *)0x0) {
          sprintf(buf,"O[%5d] %-13.13s inside              O[%5d] %2d-%2d %-15.15s\n\r",
                  (ulong)(uint)(int)pRVar12->arg1,pOVar3->short_descr,
                  (ulong)(uint)(int)pRVar12->arg3,(ulong)(uint)(int)pRVar12->arg2,
                  (ulong)(uint)(int)pRVar12->arg4,pOVar4->short_descr);
          break;
        }
        uVar9 = (ulong)(uint)(int)pRVar12->arg3;
        pcVar11 = "Put Object - Bad To Object %d\n\r";
      }
LAB_0039a248:
      sprintf(buf,pcVar11,uVar9);
      strcat(final,buf);
      goto LAB_0039a289;
    case 'R':
      pRVar5 = get_room_index((int)pRVar12->arg1);
      uVar9 = (ulong)(uint)(int)pRVar12->arg1;
      if (pRVar5 == (ROOM_INDEX_DATA *)0x0) {
        pcVar11 = "Randomize Exits - Bad Room %d\n\r";
        goto LAB_0039a248;
      }
      sprintf(buf,"R[%5d] Exits are randomized in %s\n\r",uVar9,pRVar5->name);
    }
    strcat(final,buf);
LAB_0039a05a:
    send_to_char(final,ch);
LAB_0039a289:
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void display_resets(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *pRoom;
	RESET_DATA *pReset;
	MOB_INDEX_DATA *pMob = nullptr;
	char buf[MAX_STRING_LENGTH];
	char final[MAX_STRING_LENGTH];
	int iReset = 0;

	EDIT_ROOM(ch, pRoom);
	final[0] = '\0';

	send_to_char(" No.  Loads    Description       Location         Vnum   Mx Mn Description"
				 "\n\r"
				 "==== ======== ============= =================== ======== ===== ==========="
				 "\n\r",
				 ch);

	for (pReset = pRoom->reset_first; pReset; pReset = pReset->next)
	{
		OBJ_INDEX_DATA *pObj;
		MOB_INDEX_DATA *pMobIndex;
		MOB_INDEX_DATA *pMobIndex2;
		OBJ_INDEX_DATA *pObjIndex;
		OBJ_INDEX_DATA *pObjToIndex;
		ROOM_INDEX_DATA *pRoomIndex;

		final[0] = '\0';
		sprintf(final, "[%2d] ", ++iReset);

		switch (pReset->command)
		{
			case 'M':
				if (!(pMobIndex = get_mob_index(pReset->arg1)))
				{
					sprintf(buf, "Load Mobile - Bad Mob %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				if (!(pRoomIndex = get_room_index(pReset->arg3)))
				{
					sprintf(buf, "Load Mobile - Bad Room %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				pMob = pMobIndex;
				sprintf(buf, "M[%5d] %-13.13s in room             R[%5d] %2d-%2d %-15.15s\n\r",
					pReset->arg1,
					pMob->short_descr,
					pReset->arg3,
					pReset->arg2,
					pReset->arg4,
					pRoomIndex->name);
				strcat(final, buf);

				/*
				* Check for pet shop.
				* -------------------
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoomIndex->vnum - 1);

					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						final[5] = 'P';
				}

				break;
			case 'O':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Load Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!(pRoomIndex = get_room_index(pReset->arg3)))
				{
					sprintf(buf, "Load Object - Bad Room %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				sprintf(buf,
						"O[%5d] %-13.13s in room             "\
						"R[%5d]       %-15.15s\n\r",
						pReset->arg1, pObj->short_descr, pReset->arg3, pRoomIndex->name);
				strcat(final, buf);

				break;
			case 'P':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Put Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!(pObjToIndex = get_obj_index(pReset->arg3)))
				{
					sprintf(buf, "Put Object - Bad To Object %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				sprintf(buf, "O[%5d] %-13.13s inside              O[%5d] %2d-%2d %-15.15s\n\r",
					pReset->arg1,
					pObj->short_descr,
					pReset->arg3,
					pReset->arg2,
					pReset->arg4,
					pObjToIndex->short_descr);
				strcat(final, buf);
				break;
			case 'G':
			case 'E':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Give/Equip Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!pMob)
				{
					sprintf(buf, "Give/Equip Object - No Previous Mobile\n\r");
					strcat(final, buf);
					break;
				}

				if (pMob->pShop)
				{
					sprintf(buf, "O[%5d] %-13.13s in the inventory of S[%5d]       %-15.15s\n\r",
						pReset->arg1,
						pObj->short_descr,
						pMob->vnum,
						pMob->short_descr);
				}
				else
				{
					sprintf(buf, "O[%5d] %-13.13s %-19.19s M[%5d]       %-15.15s\n\r",
						pReset->arg1,
						pObj->short_descr,
						pReset->command == 'G'
							? flag_string_old(wear_loc_strings, WEAR_NONE)
							: flag_string_old(wear_loc_strings, pReset->arg3),
						pMob->vnum, pMob->short_descr);
				}

				strcat(final, buf);
				break;
			/*
			* Doors are set in rs_flags don't need to be displayed.
			* If you want to display them then uncomment the new_reset
			* line in the case 'D' in load_resets in db.c and here.
			*/
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);
				sprintf(buf, "R[%5d] %s door of %-19.19s reset to %s\n\r",
					pReset->arg1,
					capitalize(dir_name[pReset->arg2]),
					pRoomIndex->name,
					flag_string_old(door_resets, pReset->arg3));
				strcat(final, buf);
				break;
			case 'F':
				pMobIndex = get_mob_index(pReset->arg1);
				pMobIndex2 = get_mob_index(pReset->arg2);
				sprintf(buf, "R[%5d] %-13.13s %-19.19s M[%5d]        %-15.15s\n\r",
					pMobIndex->vnum,
					pMobIndex->short_descr,
					"will follow",
					pMobIndex2->vnum,
					pMobIndex2->short_descr);
				strcat(final, buf);
				break;
			/*
			* End Doors Comment.
			*/
			case 'R':
				if (!(pRoomIndex = get_room_index(pReset->arg1)))
				{
					sprintf(buf, "Randomize Exits - Bad Room %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				sprintf(buf, "R[%5d] Exits are randomized in %s\n\r", pReset->arg1, pRoomIndex->name);
				strcat(final, buf);
				break;
			default:
				sprintf(buf, "Bad reset command: %c.", pReset->command);
				strcat(final, buf);
				break;
		}

		send_to_char(final, ch);
	}
}